

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::renderQuad
               (TestLog *log,RenderContext *renderContext,BlendState *preCommonBlendState,
               BlendState *postCommonBlendState,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers,Framebuffer *framebuffer,
               vector<tcu::TextureLevel,_std::allocator<tcu::TextureLevel>_> *refRenderbuffers)

{
  code *pcVar1;
  deUint64 gl_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  const_reference pvVar7;
  IVec2 *v;
  size_type sVar8;
  reference pvVar9;
  BlendState *blend;
  value_type local_2b0;
  deUint32 local_280;
  int local_27c;
  int renderbufferNdx;
  int bufNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bufs;
  bool requiresBlendBarriers;
  IVec2 size;
  ProgramSources local_1e0;
  undefined1 local_110 [8];
  ShaderProgram program;
  Functions *gl;
  Framebuffer *framebuffer_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  BlendState *postCommonBlendState_local;
  BlendState *preCommonBlendState_local;
  RenderContext *renderContext_local;
  TestLog *log_local;
  
  iVar4 = (*renderContext->_vptr_RenderContext[3])();
  program.m_program.m_info.linkTimeUs = (deUint64)CONCAT44(extraout_var,iVar4);
  genShaderSources(&local_1e0,preCommonBlendState,postCommonBlendState,drawBuffers,renderContext);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_110,(Functions *)CONCAT44(extraout_var,iVar4),&local_1e0);
  glu::ProgramSources::~ProgramSources(&local_1e0);
  pvVar7 = std::
           vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
           ::operator[](drawBuffers,0);
  v = DrawBufferInfo::getSize(pvVar7);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xfffffffffffffe0c,v);
  BlendState::BlendState
            ((BlendState *)
             &bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,postCommonBlendState);
  bVar2 = requiresAdvancedBlendEq
                    (preCommonBlendState,
                     (BlendState *)
                     &bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,drawBuffers);
  BlendState::~BlendState
            ((BlendState *)
             &bufs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx);
  sVar8 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
          ::size(drawBuffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx,sVar8);
  local_27c = 0;
  while( true ) {
    sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx);
    if ((int)sVar8 <= local_27c) break;
    pvVar7 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             ::operator[](drawBuffers,(long)local_27c);
    bVar3 = DrawBufferInfo::getRender(pvVar7);
    if (bVar3) {
      local_2b0 = local_27c + 0x8ce0;
    }
    else {
      local_2b0 = 0;
    }
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx,
                        (long)local_27c);
    *pvVar9 = local_2b0;
    local_27c = local_27c + 1;
  }
  glu::operator<<(log,(ShaderProgram *)local_110);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1a00);
  iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&stack0xfffffffffffffe0c);
  iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&stack0xfffffffffffffe0c);
  (*pcVar1)(0,0,iVar4,iVar5);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_110);
  (*pcVar1)(dVar6);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x78);
  dVar6 = glu::ObjectWrapper::operator*(&framebuffer->super_ObjectWrapper);
  (*pcVar1)(0x8d40,dVar6);
  setCommonBlendState((Functions *)program.m_program.m_info.linkTimeUs,preCommonBlendState);
  local_280 = 0;
  while( true ) {
    sVar8 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
            ::size(drawBuffers);
    gl_00 = program.m_program.m_info.linkTimeUs;
    if ((int)sVar8 <= (int)local_280) break;
    pvVar7 = std::
             vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
             ::operator[](drawBuffers,(long)(int)local_280);
    blend = DrawBufferInfo::getBlendState(pvVar7);
    setIndexedBlendState((Functions *)gl_00,blend,local_280);
    local_280 = local_280 + 1;
  }
  setCommonBlendState((Functions *)program.m_program.m_info.linkTimeUs,postCommonBlendState);
  pcVar1 = *(code **)(program.m_program.m_info.linkTimeUs + 0x560);
  sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx);
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx,0);
  (*pcVar1)(sVar8 & 0xffffffff,pvVar9);
  if (bVar2) {
    (**(code **)(program.m_program.m_info.linkTimeUs + 0xf0))();
  }
  renderGLQuad(renderContext,(ShaderProgram *)local_110);
  if (bVar2) {
    (**(code **)(program.m_program.m_info.linkTimeUs + 0xf0))();
  }
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x560))(0,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x78))(0x8d40,0);
  (**(code **)(program.m_program.m_info.linkTimeUs + 0x1680))(0);
  dVar6 = (**(code **)(program.m_program.m_info.linkTimeUs + 0x800))();
  glu::checkError(dVar6,"Failed to render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x414);
  renderRefQuad(preCommonBlendState,postCommonBlendState,drawBuffers,refRenderbuffers);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&renderbufferNdx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_110);
  return;
}

Assistant:

void renderQuad (TestLog&						log,
				 glu::RenderContext&			renderContext,
				 const BlendState&				preCommonBlendState,
				 const BlendState&				postCommonBlendState,
				 const vector<DrawBufferInfo>&	drawBuffers,
				 const glu::Framebuffer&		framebuffer,
				 vector<TextureLevel>&			refRenderbuffers)
{
	const glw::Functions&		gl						= renderContext.getFunctions();
	const glu::ShaderProgram	program					(gl, genShaderSources(preCommonBlendState, postCommonBlendState, drawBuffers, renderContext));
	const IVec2					size					= drawBuffers[0].getSize();
	const bool					requiresBlendBarriers	= requiresAdvancedBlendEq(preCommonBlendState, postCommonBlendState, drawBuffers);

	vector<deUint32> bufs;

	bufs.resize(drawBuffers.size());

	for (int bufNdx = 0; bufNdx < (int)bufs.size(); bufNdx++)
		bufs[bufNdx] = (drawBuffers[bufNdx].getRender() ? GL_COLOR_ATTACHMENT0 + bufNdx : GL_NONE);

	log << program;

	gl.viewport(0, 0, size.x(), size.y());
	gl.useProgram(program.getProgram());
	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	setCommonBlendState(gl, preCommonBlendState);

	for (int renderbufferNdx = 0; renderbufferNdx < (int)drawBuffers.size(); renderbufferNdx++)
		setIndexedBlendState(gl, drawBuffers[renderbufferNdx].getBlendState(), renderbufferNdx);

	setCommonBlendState(gl, postCommonBlendState);

	gl.drawBuffers((glw::GLsizei)bufs.size(), &(bufs[0]));

	if (requiresBlendBarriers)
		gl.blendBarrier();

	renderGLQuad(renderContext, program);

	if (requiresBlendBarriers)
		gl.blendBarrier();

	gl.drawBuffers(0, 0);
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
	gl.useProgram(0);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to render");

	renderRefQuad(preCommonBlendState, postCommonBlendState, drawBuffers, refRenderbuffers);
}